

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_key_schedule_t *
key_schedule_new(ptls_cipher_suite_t *preferred,ptls_cipher_suite_t **offered,
                char *hkdf_label_prefix)

{
  long lVar1;
  ptls_key_schedule_t *sched_00;
  ptls_hash_context_t *ppVar2;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t j_1;
  size_t i_1;
  ptls_cipher_suite_t *cs_1;
  size_t j;
  size_t i;
  ptls_cipher_suite_t *cs;
  size_t num_hashes;
  ptls_key_schedule_t *sched;
  long local_c8;
  long local_c0;
  undefined1 local_b0 [8];
  char *local_a8;
  long local_48;
  long local_40;
  long local_38;
  ulong local_30;
  ptls_key_schedule_t *local_28;
  char *local_20;
  long local_18;
  long local_10;
  ptls_key_schedule_t *local_8;
  
  local_20 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_20 = "tls13 ";
  }
  local_30 = (ulong)(in_RDI != 0);
  local_38 = in_RDI;
  if (in_RSI != 0) {
    for (local_40 = 0; lVar1 = *(long *)(in_RSI + local_40 * 8), lVar1 != 0; local_40 = local_40 + 1
        ) {
      if ((in_RDI == 0) || (*(long *)(lVar1 + 0x10) != *(long *)(in_RDI + 0x10))) {
        local_48 = 0;
        while ((local_48 != local_40 &&
               (*(long *)(lVar1 + 0x10) != *(long *)(*(long *)(in_RSI + local_48 * 8) + 0x10)))) {
          local_48 = local_48 + 1;
        }
        if (local_48 == local_40) {
          local_30 = local_30 + 1;
        }
      }
    }
    local_38 = 0;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  sched_00 = (ptls_key_schedule_t *)malloc(local_30 * 0x10 + 0x58);
  if (sched_00 == (ptls_key_schedule_t *)0x0) {
    local_8 = (ptls_key_schedule_t *)0x0;
  }
  else {
    local_28 = sched_00;
    memset(local_b0,0,0x68);
    local_a8 = local_20;
    memcpy(sched_00,local_b0,0x68);
    if (local_10 != 0) {
      local_28->hashes[local_28->num_hashes].algo = *(ptls_hash_algorithm_t **)(local_10 + 0x10);
      ppVar2 = (ptls_hash_context_t *)(**(code **)(*(long *)(local_10 + 0x10) + 0x10))();
      local_28->hashes[local_28->num_hashes].ctx = ppVar2;
      if (ppVar2 == (ptls_hash_context_t *)0x0) {
LAB_00115ff3:
        key_schedule_free(sched_00);
        return (ptls_key_schedule_t *)0x0;
      }
      local_28->num_hashes = local_28->num_hashes + 1;
    }
    if (local_18 != 0) {
      for (local_c0 = 0; lVar1 = *(long *)(local_18 + local_c0 * 8), lVar1 != 0;
          local_c0 = local_c0 + 1) {
        if ((local_10 == 0) || (*(long *)(lVar1 + 0x10) != *(long *)(local_10 + 0x10))) {
          local_c8 = 0;
          while ((local_c8 != local_c0 &&
                 (*(long *)(lVar1 + 0x10) != *(long *)(*(long *)(local_18 + local_c8 * 8) + 0x10))))
          {
            local_c8 = local_c8 + 1;
          }
          if (local_c8 == local_c0) {
            local_28->hashes[local_28->num_hashes].algo = *(ptls_hash_algorithm_t **)(lVar1 + 0x10);
            ppVar2 = (ptls_hash_context_t *)(**(code **)(*(long *)(lVar1 + 0x10) + 0x10))();
            local_28->hashes[local_28->num_hashes].ctx = ppVar2;
            if (ppVar2 == (ptls_hash_context_t *)0x0) goto LAB_00115ff3;
            local_28->num_hashes = local_28->num_hashes + 1;
          }
        }
      }
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static ptls_key_schedule_t *key_schedule_new(ptls_cipher_suite_t *preferred, ptls_cipher_suite_t **offered,
                                             const char *hkdf_label_prefix)
{
#define FOREACH_HASH(block)                                                                                                        \
    do {                                                                                                                           \
        ptls_cipher_suite_t *cs;                                                                                                   \
        if ((cs = preferred) != NULL) {                                                                                            \
            block                                                                                                                  \
        }                                                                                                                          \
        if (offered != NULL) {                                                                                                     \
            size_t i, j;                                                                                                           \
            for (i = 0; (cs = offered[i]) != NULL; ++i) {                                                                          \
                if (preferred == NULL || cs->hash != preferred->hash) {                                                            \
                    for (j = 0; j != i; ++j)                                                                                       \
                        if (cs->hash == offered[j]->hash)                                                                          \
                            break;                                                                                                 \
                    if (j == i) {                                                                                                  \
                        block                                                                                                      \
                    }                                                                                                              \
                }                                                                                                                  \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)

    ptls_key_schedule_t *sched;

    if (hkdf_label_prefix == NULL)
        hkdf_label_prefix = PTLS_HKDF_EXPAND_LABEL_PREFIX;

    { /* allocate */
        size_t num_hashes = 0;
        FOREACH_HASH({ ++num_hashes; });
        if ((sched = malloc(offsetof(ptls_key_schedule_t, hashes) + sizeof(sched->hashes[0]) * num_hashes)) == NULL)
            return NULL;
        *sched = (ptls_key_schedule_t){0, hkdf_label_prefix};
    }

    /* setup the hash algos and contexts */
    FOREACH_HASH({
        sched->hashes[sched->num_hashes].algo = cs->hash;
        if ((sched->hashes[sched->num_hashes].ctx = cs->hash->create()) == NULL)
            goto Fail;
        ++sched->num_hashes;
    });

    return sched;
Fail:
    key_schedule_free(sched);
    return NULL;

#undef FOREACH_HASH
}